

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Maybe<kj::CompressionParameters> *
kj::_::tryParseAllExtensionOffers
          (Maybe<kj::CompressionParameters> *__return_storage_ptr__,StringPtr offers,
          CompressionParameters *manualConfig)

{
  bool bVar1;
  undefined2 uVar2;
  char *pcVar3;
  undefined8 uVar4;
  ArrayPtr<const_char> *pAVar5;
  undefined8 uVar6;
  char cVar7;
  undefined1 uVar8;
  byte bVar9;
  ArrayPtr<const_char> *pAVar10;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 in_R8;
  byte bVar11;
  undefined2 uVar12;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar13;
  ArrayPtr<const_char> *pAVar14;
  int iVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  ArrayPtr<const_char> input;
  ArrayPtr<const_char> input_00;
  Vector<kj::ArrayPtr<const_char>_> splitOffer;
  Vector<kj::ArrayPtr<const_char>_> splitOffers;
  unsigned_long manualBits;
  bool local_10a;
  bool local_109;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_108;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_100;
  undefined1 local_e8 [16];
  ArrayPtr<const_char> *local_d8;
  ArrayDisposer *local_d0;
  undefined1 local_c8 [16];
  ArrayPtr<const_char> *local_b8;
  ArrayDisposer *local_b0;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_a0;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_98;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_90;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_88;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_80;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_78;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_70;
  CompressionParameters *local_68;
  Maybe<kj::CompressionParameters> local_60;
  
  input.ptr = (char *)(offers.content.size_ - 1);
  input.size_ = 0x2c;
  splitParts((Vector<kj::ArrayPtr<const_char>_> *)local_c8,(_ *)offers.content.ptr,input,
             (char)in_R8.value);
  uVar6 = local_c8._8_8_;
  if (local_c8._0_8_ == local_c8._8_8_) {
    uVar8 = false;
  }
  else {
    uVar8 = (__return_storage_ptr__->ptr).isSet;
    uVar12 = *(undefined2 *)&(__return_storage_ptr__->ptr).field_1;
    local_109 = (__return_storage_ptr__->ptr).field_1.value.outboundMaxWindowBits.ptr.isSet;
    local_108 = *(anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)
                 ((long)&(__return_storage_ptr__->ptr).field_1 + 0x10);
    local_10a = (__return_storage_ptr__->ptr).field_1.value.inboundMaxWindowBits.ptr.isSet;
    local_100 = *(anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)
                 ((long)&(__return_storage_ptr__->ptr).field_1 + 0x20);
    pAVar14 = (ArrayPtr<const_char> *)local_c8._0_8_;
    local_68 = manualConfig;
    do {
      input_00.size_ = 0x3b;
      input_00.ptr = (char *)pAVar14->size_;
      splitParts((Vector<kj::ArrayPtr<const_char>_> *)local_e8,(_ *)pAVar14->ptr,input_00,
                 (char)in_R8.value);
      iVar15 = 3;
      pAVar10 = (ArrayPtr<const_char> *)local_e8._0_8_;
      if (*(size_t *)(local_e8._0_8_ + 8) == 0x12) {
        pcVar3 = *(char **)local_e8._0_8_;
        auVar16[0] = -(*pcVar3 == 'p');
        auVar16[1] = -(pcVar3[1] == 'e');
        auVar16[2] = -(pcVar3[2] == 'r');
        auVar16[3] = -(pcVar3[3] == 'm');
        auVar16[4] = -(pcVar3[4] == 'e');
        auVar16[5] = -(pcVar3[5] == 's');
        auVar16[6] = -(pcVar3[6] == 's');
        auVar16[7] = -(pcVar3[7] == 'a');
        auVar16[8] = -(pcVar3[8] == 'g');
        auVar16[9] = -(pcVar3[9] == 'e');
        auVar16[10] = -(pcVar3[10] == '-');
        auVar16[0xb] = -(pcVar3[0xb] == 'd');
        auVar16[0xc] = -(pcVar3[0xc] == 'e');
        auVar16[0xd] = -(pcVar3[0xd] == 'f');
        auVar16[0xe] = -(pcVar3[0xe] == 'l');
        auVar16[0xf] = -(pcVar3[0xf] == 'a');
        auVar17[0] = -((char)*(undefined2 *)(pcVar3 + 0x10) == 't');
        auVar17[1] = -((char)((ushort)*(undefined2 *)(pcVar3 + 0x10) >> 8) == 'e');
        auVar17[2] = 0xff;
        auVar17[3] = 0xff;
        auVar17[4] = 0xff;
        auVar17[5] = 0xff;
        auVar17[6] = 0xff;
        auVar17[7] = 0xff;
        auVar17[8] = 0xff;
        auVar17[9] = 0xff;
        auVar17[10] = 0xff;
        auVar17[0xb] = 0xff;
        auVar17[0xc] = 0xff;
        auVar17[0xd] = 0xff;
        auVar17[0xe] = 0xff;
        auVar17[0xf] = 0xff;
        auVar17 = auVar17 & auVar16;
        if ((ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar17[0xf] >> 7) << 0xf) != 0xffff) goto LAB_003eba5e;
        tryExtractParameters(&local_60,(Vector<kj::ArrayPtr<const_char>_> *)local_e8,false);
        if (local_60.ptr.isSet == true) {
          iVar15 = 1;
          if (local_60.ptr.field_1.value.outboundMaxWindowBits.ptr.isSet != false) {
            local_98 = local_60.ptr.field_1.value.outboundMaxWindowBits.ptr.field_1;
          }
          if (local_60.ptr.field_1.value.inboundMaxWindowBits.ptr.isSet != false) {
            local_78 = local_60.ptr.field_1.value.inboundMaxWindowBits.ptr.field_1;
          }
          cVar7 = (local_68->outboundMaxWindowBits).ptr.isSet;
          if ((bool)cVar7 == true) {
            local_90 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)
                       (local_68->outboundMaxWindowBits).ptr.field_1.value;
          }
          bVar1 = (local_68->inboundMaxWindowBits).ptr.isSet;
          if (bVar1 == true) {
            local_70 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)
                       (local_68->inboundMaxWindowBits).ptr.field_1.value;
          }
          uVar2._0_1_ = local_68->outboundNoContextTakeover;
          uVar2._1_1_ = local_68->inboundNoContextTakeover;
          if (((undefined1)uVar2 == '\0') && ((local_60.ptr.field_1._0_2_ & 1) != 0))
          goto LAB_003eb96d;
          aVar13 = local_70;
          bVar11 = bVar1;
          if (local_78.value < local_70.value) {
            bVar11 = 1;
            aVar13 = local_78;
          }
          bVar9 = bVar1;
          if (bVar1 != false) {
            bVar9 = 0;
          }
          if ((bVar1 & local_60.ptr.field_1.value.inboundMaxWindowBits.ptr.isSet) == 0) {
            aVar13 = local_70;
            bVar11 = bVar9;
          }
          if ((bool)cVar7 == false) {
            in_R8 = local_70;
            if (local_60.ptr.field_1.value.outboundMaxWindowBits.ptr.isSet == false)
            goto LAB_003eb9f3;
            iVar15 = 0;
          }
          else {
            in_R8 = local_98;
            local_a0 = local_90;
            if ((local_60.ptr.field_1.value.outboundMaxWindowBits.ptr.isSet &
                local_98.value < local_90.value) != 0) {
              cVar7 = '\x01';
              local_a0 = local_98;
            }
LAB_003eb9f3:
            if (cVar7 != '\0') {
              local_108 = local_a0;
              local_80 = local_a0;
            }
            if (bVar11 != 0) {
              local_100 = aVar13;
              local_88 = aVar13;
            }
            uVar8 = 1;
            uVar12 = uVar2;
            local_10a = (bool)bVar11;
            local_109 = (bool)cVar7;
          }
        }
        else {
LAB_003eb96d:
          iVar15 = 0;
        }
        pAVar10 = (ArrayPtr<const_char> *)local_e8._0_8_;
        if ((ArrayPtr<const_char> *)local_e8._0_8_ != (ArrayPtr<const_char> *)0x0)
        goto LAB_003eba5e;
      }
      else {
LAB_003eba5e:
        pAVar5 = local_d8;
        uVar4 = local_e8._8_8_;
        local_e8 = (undefined1  [16])0x0;
        local_d8 = (ArrayPtr<const_char> *)0x0;
        in_R8.value = (long)pAVar5 - (long)pAVar10 >> 4;
        (**local_d0->_vptr_ArrayDisposer)
                  (local_d0,pAVar10,0x10,uVar4 - (long)pAVar10 >> 4,in_R8.value,0);
      }
      if ((iVar15 != 3) && (iVar15 != 0)) goto LAB_003ebad4;
      pAVar14 = pAVar14 + 1;
    } while (pAVar14 != (ArrayPtr<const_char> *)uVar6);
    uVar8 = 0;
LAB_003ebad4:
    *(undefined2 *)&(__return_storage_ptr__->ptr).field_1 = uVar12;
    (__return_storage_ptr__->ptr).field_1.value.outboundMaxWindowBits.ptr.isSet = local_109;
    *(anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)
     ((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) = local_108;
    (__return_storage_ptr__->ptr).field_1.value.inboundMaxWindowBits.ptr.isSet = local_10a;
    *(anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)
     ((long)&(__return_storage_ptr__->ptr).field_1 + 0x20) = local_100;
  }
  pAVar14 = local_b8;
  (__return_storage_ptr__->ptr).isSet = (bool)uVar8;
  uVar6 = local_c8._0_8_;
  if ((ArrayPtr<const_char> *)local_c8._0_8_ != (ArrayPtr<const_char> *)0x0) {
    uVar4 = local_c8._8_8_;
    local_c8 = (undefined1  [16])0x0;
    local_b8 = (ArrayPtr<const_char> *)0x0;
    (**local_b0->_vptr_ArrayDisposer)
              (local_b0,uVar6,0x10,(long)(uVar4 - uVar6) >> 4,(long)pAVar14 - uVar6 >> 4,0);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<CompressionParameters> tryParseAllExtensionOffers(StringPtr offers,
    CompressionParameters manualConfig) {
  // Similar to `tryParseExtensionOffers()`, however, this function is called when parsing in
  // `MANUAL_COMPRESSION` mode. In some cases, the server's configuration might not support the
  // `server_no_context_takeover` or `server_max_window_bits` parameters. Essentially, this function
  // will look at all the client's offers, and accept the first one that it can support.
  //
  // We differentiate these functions because in `AUTOMATIC_COMPRESSION` mode, KJ can support these
  // server restricting compression parameters.
  auto splitOffers = splitParts(offers, ',');

  for (const auto& offer : splitOffers) {
    auto splitOffer = splitParts(offer, ';');

    if (splitOffer.front() != "permessage-deflate"_kj) {
      // Extension token was invalid.
      continue;
    }
    KJ_IF_SOME(config, tryExtractParameters(splitOffer, false)) {
      KJ_IF_SOME(finalConfig, compareClientAndServerConfigs(config, manualConfig)) {
        // Found a compatible configuration between the server's config and client's offer.
        return kj::mv(finalConfig);
      }
    }
  }
  return kj::none;
}